

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimacs.cc
# Opt level: O0

InputGraph read_dimacs(ifstream *infile,string *filename)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  istream *piVar5;
  undefined8 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  istream *in_RSI;
  _Head_base<0UL,_InputGraph::Imp_*,_false> in_RDI;
  int v;
  int b;
  int a;
  smatch match;
  string line;
  InputGraph *result;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  allocator<char> *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  undefined2 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdba;
  undefined1 uVar7;
  undefined4 in_stack_fffffffffffffdbb;
  undefined1 in_stack_fffffffffffffdbf;
  int in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc4;
  int in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  InputGraph *in_stack_fffffffffffffe10;
  string_view in_stack_fffffffffffffe18;
  int local_1c0;
  string local_40 [39];
  byte local_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  istream *local_10;
  
  local_19 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  InputGraph::InputGraph
            ((InputGraph *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             CONCAT13(in_stack_fffffffffffffdbf,(int3)((uint)in_stack_fffffffffffffdbb >> 8)),
             SUB41(in_stack_fffffffffffffdbb,0),(bool)in_stack_fffffffffffffdba);
  std::__cxx11::string::string(in_stack_fffffffffffffd80);
  do {
    do {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_10,local_40);
      bVar1 = std::ios::operator_cast_to_bool(piVar5 + *(long *)(*(long *)piVar5 + -0x18));
      if (!bVar1) {
        bVar2 = std::ios::eof();
        if ((bVar2 & 1) != 0) {
          local_1c0 = 0;
          while (iVar3 = local_1c0, iVar4 = InputGraph::size((InputGraph *)0x210929), iVar3 < iVar4)
          {
            std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(iVar4,iVar3));
            InputGraph::set_vertex_name
                      (in_stack_fffffffffffffe10,(int)((ulong)in_RDI._M_head_impl >> 0x20),
                       in_stack_fffffffffffffe18);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(iVar4,iVar3));
            local_1c0 = local_1c0 + 1;
          }
          local_19 = 1;
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(iVar4,iVar3));
          if ((local_19 & 1) == 0) {
            InputGraph::~InputGraph((InputGraph *)0x210a2b);
          }
          return (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
                 (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
                 in_RDI._M_head_impl;
        }
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        GraphFileError::GraphFileError
                  ((GraphFileError *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                   (string *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                   (string *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                   (bool)in_stack_fffffffffffffdbf);
        __cxa_throw(uVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
      }
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x21000e);
    } while (bVar1);
    if ((read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::comment_abi_cxx11_ == '\0') &&
       (iVar3 = __cxa_guard_acquire(&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::
                                     comment_abi_cxx11_), iVar3 != 0)) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffdb0,
                 in_stack_fffffffffffffda8,(flag_type)((ulong)in_stack_fffffffffffffda0 >> 0x20));
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::comment_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::
                           comment_abi_cxx11_);
    }
    if ((read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::problem_abi_cxx11_ == '\0') &&
       (iVar3 = __cxa_guard_acquire(&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::
                                     problem_abi_cxx11_), iVar3 != 0)) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffdb0,
                 in_stack_fffffffffffffda8,(flag_type)((ulong)in_stack_fffffffffffffda0 >> 0x20));
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::problem_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::
                           problem_abi_cxx11_);
    }
    if ((read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::edge_abi_cxx11_ == '\0') &&
       (iVar3 = __cxa_guard_acquire(&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::
                                     edge_abi_cxx11_), iVar3 != 0)) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffdb0,
                 in_stack_fffffffffffffda8,(flag_type)((ulong)in_stack_fffffffffffffda0 >> 0x20));
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::edge_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::edge_abi_cxx11_
                         );
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                       in_stack_fffffffffffffd88,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                       in_stack_fffffffffffffd80,
                       (match_flag_type)((ulong)in_stack_fffffffffffffd78 >> 0x20));
    if (!bVar1) {
      bVar1 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                         in_stack_fffffffffffffd88,
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                         in_stack_fffffffffffffd80,
                         (match_flag_type)((ulong)in_stack_fffffffffffffd78 >> 0x20));
      if (bVar1) {
        iVar3 = InputGraph::size((InputGraph *)0x210254);
        if (iVar3 != 0) {
          uVar6 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
          GraphFileError::GraphFileError
                    ((GraphFileError *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0)
                     ,(string *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     (string *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     (bool)in_stack_fffffffffffffdbf);
          __cxa_throw(uVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
        }
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)in_stack_fffffffffffffd78,
              CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
        in_stack_fffffffffffffdd4 =
             std::__cxx11::stoi((string *)
                                CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                                (size_t *)
                                CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),0);
        InputGraph::resize((InputGraph *)in_stack_fffffffffffffd80,
                           (int)((ulong)in_stack_fffffffffffffd78 >> 0x20));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
      }
      else {
        bVar1 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                           in_stack_fffffffffffffd88,
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                           in_stack_fffffffffffffd80,
                           (match_flag_type)((ulong)in_stack_fffffffffffffd78 >> 0x20));
        in_stack_fffffffffffffdd0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdd0);
        if (!bVar1) {
          uVar6 = __cxa_allocate_exception(0x30);
          std::operator+((char *)CONCAT17(in_stack_fffffffffffffdbf,
                                          CONCAT43(in_stack_fffffffffffffdbb,
                                                   CONCAT12(in_stack_fffffffffffffdba,
                                                            in_stack_fffffffffffffdb8))),
                         in_stack_fffffffffffffdb0);
          std::operator+(in_stack_fffffffffffffd78,
                         (char *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
          GraphFileError::GraphFileError
                    ((GraphFileError *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0)
                     ,(string *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     (string *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     (bool)in_stack_fffffffffffffdbf);
          __cxa_throw(uVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
        }
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)in_stack_fffffffffffffd78,
              CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
        iVar3 = std::__cxx11::stoi((string *)
                                   CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                                   (size_t *)
                                   CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
        in_stack_fffffffffffffdcc = iVar3;
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)in_stack_fffffffffffffd78,
              CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
        iVar4 = std::__cxx11::stoi((string *)
                                   CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                                   (size_t *)
                                   CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
        in_stack_fffffffffffffdc8 = iVar4;
        if (((iVar3 == 0) || (iVar4 == 0)) ||
           (in_stack_fffffffffffffdc4 = InputGraph::size((InputGraph *)0x2104e7),
           in_stack_fffffffffffffdc0 = iVar3, in_stack_fffffffffffffdc4 < iVar3)) {
LAB_00210527:
          uVar6 = __cxa_allocate_exception(0x30);
          std::operator+((char *)CONCAT17(in_stack_fffffffffffffdbf,
                                          CONCAT43(in_stack_fffffffffffffdbb,
                                                   CONCAT12(in_stack_fffffffffffffdba,
                                                            in_stack_fffffffffffffdb8))),local_18);
          std::operator+(in_stack_fffffffffffffd78,
                         (char *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
          GraphFileError::GraphFileError
                    ((GraphFileError *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0)
                     ,(string *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     (string *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     (bool)in_stack_fffffffffffffdbf);
          __cxa_throw(uVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
        }
        in_stack_fffffffffffffdb8 = (undefined2)iVar4;
        in_stack_fffffffffffffdba = (undefined1)((uint)iVar4 >> 0x10);
        uVar7 = (undefined1)((uint)iVar4 >> 0x18);
        iVar4 = InputGraph::size((InputGraph *)0x210511);
        in_stack_fffffffffffffdbb = CONCAT31((int3)iVar4,uVar7);
        in_stack_fffffffffffffdbf = (undefined1)((uint)iVar4 >> 0x18);
        in_stack_fffffffffffffdc0 = iVar3;
        if (iVar4 < CONCAT13(uVar7,CONCAT12(in_stack_fffffffffffffdba,in_stack_fffffffffffffdb8)))
        goto LAB_00210527;
        InputGraph::add_edge
                  ((InputGraph *)in_stack_fffffffffffffdb0,
                   (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),(int)in_stack_fffffffffffffda8);
        in_stack_fffffffffffffdc0 = iVar3;
      }
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)0x2107d3);
  } while( true );
}

Assistant:

auto read_dimacs(ifstream && infile, const string & filename) -> InputGraph
{
    InputGraph result{0, false, false};

    string line;
    while (getline(infile, line)) {
        if (line.empty())
            continue;

        /* Lines are comments, a problem description (contains the number of
         * vertices), or an edge. */
        static const regex
            comment{R"(c(\s.*)?)"},
            problem{R"(p\s+(edge|col)\s+(\d+)\s+(\d+)?\s*)"},
            edge{R"(e\s+(\d+)\s+(\d+)\s*)"};

        smatch match;
        if (regex_match(line, match, comment)) {
            /* Comment, ignore */
        }
        else if (regex_match(line, match, problem)) {
            /* Problem. Specifies the size of the graph. Must happen exactly
             * once. */
            if (0 != result.size())
                throw GraphFileError{filename, "multiple 'p' lines encountered", true};
            result.resize(stoi(match.str(2)));
        }
        else if (regex_match(line, match, edge)) {
            /* An edge. DIMACS files are 1-indexed. We assume we've already had
             * a problem line (if not our size will be 0, so we'll throw). */
            int a{stoi(match.str(1))}, b{stoi(match.str(2))};
            if (0 == a || 0 == b || a > result.size() || b > result.size())
                throw GraphFileError{filename, "line '" + line + "' edge index out of bounds", true};
            result.add_edge(a - 1, b - 1);
        }
        else
            throw GraphFileError{filename, "cannot parse line '" + line + "'", true};
    }

    if (! infile.eof())
        throw GraphFileError{filename, "error reading file", true};

    for (int v = 0; v < result.size(); ++v)
        result.set_vertex_name(v, to_string(v + 1));

    return result;
}